

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void __thiscall
ir_expression::ir_expression
          (ir_expression *this,int op,glsl_type *type,ir_rvalue *op0,ir_rvalue *op1,ir_rvalue *op2,
          ir_rvalue *op3)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  (this->super_ir_rvalue).super_ir_instruction.super_exec_node.next = (exec_node *)0x0;
  (this->super_ir_rvalue).super_ir_instruction.super_exec_node.prev = (exec_node *)0x0;
  (this->super_ir_rvalue).super_ir_instruction.ir_type = ir_type_expression;
  (this->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction =
       (_func_int **)&PTR__ir_instruction_002628a0;
  (this->super_ir_rvalue).type = type;
  this->operation = op;
  this->operands[0] = op0;
  this->operands[1] = op1;
  this->operands[2] = op2;
  this->operands[3] = op3;
  if (op == 0x98) {
    uVar2 = (uint)type->vector_elements;
  }
  else {
    uVar2 = get_num_operands(op);
  }
  bVar1 = (byte)uVar2;
  this->num_operands = bVar1;
  uVar3 = (ulong)(uVar2 & 0xff);
  if (bVar1 < 4) {
    do {
      if (this->operands[uVar3] != (ir_rvalue *)0x0) {
        __assert_fail("this->operands[i] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                      ,0xd2,
                      "ir_expression::ir_expression(int, const struct glsl_type *, ir_rvalue *, ir_rvalue *, ir_rvalue *, ir_rvalue *)"
                     );
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 4);
  }
  if (bVar1 != 0) {
    uVar3 = 0;
    do {
      if (this->operands[uVar3] == (ir_rvalue *)0x0) {
        __assert_fail("this->operands[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                      ,0xd6,
                      "ir_expression::ir_expression(int, const struct glsl_type *, ir_rvalue *, ir_rvalue *, ir_rvalue *, ir_rvalue *)"
                     );
      }
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0xff) != uVar3);
  }
  return;
}

Assistant:

ir_expression::ir_expression(int op, const struct glsl_type *type,
			     ir_rvalue *op0, ir_rvalue *op1,
			     ir_rvalue *op2, ir_rvalue *op3)
   : ir_rvalue(ir_type_expression)
{
   this->type = type;
   this->operation = ir_expression_operation(op);
   this->operands[0] = op0;
   this->operands[1] = op1;
   this->operands[2] = op2;
   this->operands[3] = op3;
   init_num_operands();

#ifndef NDEBUG
   for (unsigned i = num_operands; i < 4; i++) {
      assert(this->operands[i] == NULL);
   }

   for (unsigned i = 0; i < num_operands; i++) {
      assert(this->operands[i] != NULL);
   }
#endif
}